

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::CallCountScanner::create(CallCountScanner *this)

{
  unique_ptr<wasm::CallCountScanner,_std::default_delete<wasm::CallCountScanner>_> local_20 [2];
  CallCountScanner *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::CallCountScanner,std::unordered_map<wasm::Name,std::atomic<unsigned_int>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::atomic<unsigned_int>>>>*&>
            ((unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
              **)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::CallCountScanner,std::default_delete<wasm::CallCountScanner>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::CallCountScanner,_std::default_delete<wasm::CallCountScanner>_>::~unique_ptr
            (local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<CallCountScanner>(counts);
  }